

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void backpressure_check(CManager_conflict cm,EVstone s)

{
  undefined4 in_ESI;
  long in_RDI;
  int high_threshold;
  int low_threshold;
  int old_stalled;
  stone_type stone;
  event_path_data in_stack_ffffffffffffffb8;
  int new_value;
  undefined4 in_stack_ffffffffffffffd0;
  int local_24;
  int local_20;
  int local_1c;
  stone_type local_18;
  undefined4 local_c;
  long local_8;
  
  if (*(int *)(*(long *)(in_RDI + 0x118) + 0x98) != 0) {
    local_c = in_ESI;
    local_8 = in_RDI;
    local_18 = stone_struct(in_stack_ffffffffffffffb8,0);
    local_1c = local_18->is_stalled;
    local_20 = 0x32;
    local_24 = 200;
    if (local_18->stone_attrs != (attr_list)0x0) {
      if (backpressure_check::EV_BACKPRESSURE_HIGH == -1) {
        backpressure_check::EV_BACKPRESSURE_HIGH = attr_atom_from_string("EV_BACKPRESSURE_HIGH");
        backpressure_check::EV_BACKPRESSURE_LOW = attr_atom_from_string("EV_BACKPRESSURE_LOW");
      }
      get_int_attr(local_18->stone_attrs,backpressure_check::EV_BACKPRESSURE_HIGH,&local_24);
      get_int_attr(local_18->stone_attrs,backpressure_check::EV_BACKPRESSURE_LOW,&local_20);
    }
    new_value = local_24;
    if (local_1c != 0) {
      new_value = local_20;
    }
    backpressure_transition
              ((CManager_conflict)CONCAT44(local_c,in_stack_ffffffffffffffd0),
               (EVstone)((ulong)local_8 >> 0x20),(stall_source)local_8,new_value);
  }
  return;
}

Assistant:

static void
backpressure_check(CManager cm, EVstone s) {
    if (cm->evp->use_backpressure) {
        stone_type stone = stone_struct(cm->evp, s);
        int old_stalled = stone->is_stalled;
        int low_threshold = 50, high_threshold = 200;
        if (stone->stone_attrs) {
	    static atom_t EV_BACKPRESSURE_HIGH = -1;
	    static atom_t EV_BACKPRESSURE_LOW = -1;
	    if (EV_BACKPRESSURE_HIGH == -1) {
		EV_BACKPRESSURE_HIGH = attr_atom_from_string("EV_BACKPRESSURE_HIGH");
		EV_BACKPRESSURE_LOW = attr_atom_from_string("EV_BACKPRESSURE_LOW");
	    }
            get_int_attr(stone->stone_attrs, EV_BACKPRESSURE_HIGH, &high_threshold);
            get_int_attr(stone->stone_attrs, EV_BACKPRESSURE_LOW, &low_threshold);
        }
        backpressure_transition(cm, s, Stall_Overload,
            (stone->queue_size > (old_stalled ? low_threshold : high_threshold)));
    }
}